

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O2

void __thiscall trun::DynLibLinux::DynLibLinux(DynLibLinux *this)

{
  _Rb_tree_header *p_Var1;
  ILogger *pIVar2;
  allocator<char> local_41;
  string local_40;
  
  IDynLibrary::IDynLibrary(&this->super_IDynLibrary);
  (this->super_IDynLibrary)._vptr_IDynLibrary = (_func_int **)&PTR__DynLibLinux_0023cb38;
  (this->pathName)._M_dataplus._M_p = (pointer)&(this->pathName).field_2;
  (this->pathName)._M_string_length = 0;
  (this->pathName).field_2._M_local_buf[0] = '\0';
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  this->handle = (void *)0x0;
  this->pLogger = (ILogger *)0x0;
  (this->exports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->exports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Loader",&local_41);
  pIVar2 = gnilk::Logger::GetLogger(&local_40);
  this->pLogger = pIVar2;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

DynLibLinux::DynLibLinux() {
    this->pLogger = gnilk::Logger::GetLogger("Loader");
}